

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall wallet::CWalletTx::updateState(CWalletTx *this,Chain *chain)

{
  long lVar1;
  TxStateConfirmed *pTVar2;
  TxStateBlockConflicted *pTVar3;
  int *in_RSI;
  CWalletTx *in_RDI;
  long in_FS_OFFSET;
  TxStateBlockConflicted *conf_1;
  TxStateConfirmed *conf;
  anon_class_16_2_db57cd5c lookup_block;
  bool active;
  CWalletTx *state;
  uint256 *hash;
  anon_class_16_2_db57cd5c *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash = (uint256 *)&stack0xfffffffffffffff7;
  state = in_RDI;
  pTVar2 = state<wallet::TxStateConfirmed>(in_RDI);
  if (pTVar2 == (TxStateConfirmed *)0x0) {
    pTVar3 = state<wallet::TxStateBlockConflicted>(in_RDI);
    if (pTVar3 != (TxStateBlockConflicted *)0x0) {
      updateState::anon_class_16_2_db57cd5c::operator()
                (in_stack_fffffffffffffff0,hash,in_RSI,(TxState *)state);
    }
  }
  else {
    updateState::anon_class_16_2_db57cd5c::operator()
              (in_stack_fffffffffffffff0,hash,in_RSI,(TxState *)state);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWalletTx::updateState(interfaces::Chain& chain)
{
    bool active;
    auto lookup_block = [&](const uint256& hash, int& height, TxState& state) {
        // If tx block (or conflicting block) was reorged out of chain
        // while the wallet was shutdown, change tx status to UNCONFIRMED
        // and reset block height, hash, and index. ABANDONED tx don't have
        // associated blocks and don't need to be updated. The case where a
        // transaction was reorged out while online and then reconfirmed
        // while offline is covered by the rescan logic.
        if (!chain.findBlock(hash, FoundBlock().inActiveChain(active).height(height)) || !active) {
            state = TxStateInactive{};
        }
    };
    if (auto* conf = state<TxStateConfirmed>()) {
        lookup_block(conf->confirmed_block_hash, conf->confirmed_block_height, m_state);
    } else if (auto* conf = state<TxStateBlockConflicted>()) {
        lookup_block(conf->conflicting_block_hash, conf->conflicting_block_height, m_state);
    }
}